

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall
rlottie::internal::renderer::CompLayer::renderMatteLayer
          (CompLayer *this,VPainter *painter,VRle *mask,VRle *matteRle,Layer *layer,Layer *src,
          SurfaceCache *cache)

{
  VRle *pVVar1;
  VRle *pVVar2;
  byte bVar3;
  Format format;
  long extraout_RDX;
  VRect VVar4;
  VBitmap layerBitmap;
  VBitmap srcBitmap;
  VRect local_2a8;
  size_t local_298;
  VRle *local_290;
  VRle *local_288;
  VPainter *local_280;
  undefined1 local_278 [8];
  VPainter layerPainter;
  VPainter srcPainter;
  
  local_290 = mask;
  local_288 = matteRle;
  local_280 = painter;
  VVar4 = VPainter::clipBoundingRect(painter);
  srcPainter.mBuffer.mFormat = ARGB32_Premultiplied;
  srcPainter.mBuffer.mWidth = 0;
  srcPainter.mBuffer.mHeight = 0;
  srcPainter.mBuffer.mBuffer = (uint8_t *)0x0;
  srcPainter.mBuffer.mBytesPerLine = 0;
  srcPainter.mBuffer.mBytesPerPixel = 0;
  srcPainter.mSpanData.mBlendMode = SrcOver;
  srcPainter.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  srcPainter.mSpanData.mColorTable.super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  srcPainter.mSpanData.mOffset.mx = 0;
  srcPainter.mSpanData.mOffset.my = 0;
  srcPainter.mSpanData.mDrawableSize.mw = 0;
  srcPainter.mSpanData.mDrawableSize.mh = 0;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mFormat = ARGB32_Premultiplied;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mWidth = 0;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mHeight = 0;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mBytesPerLine = 0;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mBytesPerPixel = 0;
  srcPainter.mSpanData.mTexture.super_VRasterBuffer.mBuffer = (uint8_t *)0x0;
  srcPainter.mSpanData.fast_matrix = true;
  srcPainter.mSpanData.transformType = None;
  local_298 = (size_t)(VVar4.x2 - VVar4.x1);
  format = (Format)(VVar4._8_8_ - (VVar4._0_8_ & 0xffffffff00000000) >> 0x20);
  SurfaceCache::make_surface((SurfaceCache *)&srcBitmap,(size_t)cache,local_298,format);
  VPainter::begin(&srcPainter,&srcBitmap);
  pVVar2 = local_288;
  pVVar1 = local_290;
  (*src->_vptr_Layer[4])(src,&srcPainter,local_290,local_288,cache);
  VPainter::end(&srcPainter);
  layerPainter.mBuffer.mFormat = ARGB32_Premultiplied;
  layerPainter.mBuffer.mBuffer = (uint8_t *)0x0;
  layerPainter.mBuffer.mWidth = 0;
  layerPainter.mBuffer.mHeight = 0;
  layerPainter.mBuffer.mBytesPerLine = 0;
  layerPainter.mBuffer.mBytesPerPixel = 0;
  layerPainter.mSpanData.mBlendMode = SrcOver;
  layerPainter.mSpanData.mColorTable.
  super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  layerPainter.mSpanData.mColorTable.
  super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  layerPainter.mSpanData.mOffset.mx = 0;
  layerPainter.mSpanData.mOffset.my = 0;
  layerPainter.mSpanData.mDrawableSize.mw = 0;
  layerPainter.mSpanData.mDrawableSize.mh = 0;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mFormat = ARGB32_Premultiplied;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mWidth = 0;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mHeight = 0;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mBytesPerLine = 0;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mBytesPerPixel = 0;
  layerPainter.mSpanData.mTexture.super_VRasterBuffer.mBuffer = (uint8_t *)0x0;
  layerPainter.mSpanData.fast_matrix = true;
  layerPainter.mSpanData.transformType = None;
  SurfaceCache::make_surface((SurfaceCache *)&layerBitmap,(size_t)cache,local_298,format);
  VPainter::begin(&layerPainter,&layerBitmap);
  (*layer->_vptr_Layer[4])(layer,&layerPainter,pVVar1,pVVar2,cache);
  bVar3 = layer->mLayerData->mMatteType - Alpha;
  if (bVar3 < 4) {
    VPainter::setBlendMode(&layerPainter,*(BlendMode *)(&DAT_0013d9e0 + (ulong)bVar3 * 4));
  }
  if ((byte)(layer->mLayerData->mMatteType - Luma) < 2) {
    VBitmap::updateLuma(&srcBitmap);
  }
  local_2a8 = VPainter::clipBoundingRect(&layerPainter);
  (*layer->_vptr_Layer[3])(layer);
  if (extraout_RDX == 1) {
    (*layer->_vptr_Layer[3])(layer);
    VDrawable::rle((VDrawable *)local_278);
    local_2a8 = VRle::Data::bbox((Data *)((long)local_278 + 8));
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)local_278);
  }
  VPainter::drawBitmap(&layerPainter,&local_2a8,&srcBitmap,&local_2a8,0xff);
  VPainter::end(&layerPainter);
  VPainter::drawBitmap(local_280,&local_2a8,&layerBitmap,&local_2a8,0xff);
  std::vector<VBitmap,_std::allocator<VBitmap>_>::push_back(&cache->mCache,&srcBitmap);
  std::vector<VBitmap,_std::allocator<VBitmap>_>::push_back(&cache->mCache,&layerBitmap);
  vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&layerBitmap.mImpl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&layerPainter.mSpanData.mColorTable.
              super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vshared_ptr<VBitmap::Impl,_unsigned_long>::unref(&srcBitmap.mImpl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&srcPainter.mSpanData.mColorTable.
              super___shared_ptr<const_VColorTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void renderer::CompLayer::renderMatteLayer(VPainter *painter, const VRle &mask,
                                           const VRle &     matteRle,
                                           renderer::Layer *layer,
                                           renderer::Layer *src,
                                           SurfaceCache &   cache)
{
    VSize size = painter->clipBoundingRect().size();
    // Decide if we can use fast matte.
    // 1. draw src layer to matte buffer
    VPainter srcPainter;
    VBitmap  srcBitmap = cache.make_surface(size.width(), size.height());
    srcPainter.begin(&srcBitmap);
    src->render(&srcPainter, mask, matteRle, cache);
    srcPainter.end();

    // 2. draw layer to layer buffer
    VPainter layerPainter;
    VBitmap  layerBitmap = cache.make_surface(size.width(), size.height());
    layerPainter.begin(&layerBitmap);
    layer->render(&layerPainter, mask, matteRle, cache);

    // 2.1update composition mode
    switch (layer->matteType()) {
    case model::MatteType::Alpha:
    case model::MatteType::Luma: {
        layerPainter.setBlendMode(BlendMode::DestIn);
        break;
    }
    case model::MatteType::AlphaInv:
    case model::MatteType::LumaInv: {
        layerPainter.setBlendMode(BlendMode::DestOut);
        break;
    }
    default:
        break;
    }

    // 2.2 update srcBuffer if the matte is luma type
    if (layer->matteType() == model::MatteType::Luma ||
        layer->matteType() == model::MatteType::LumaInv) {
        srcBitmap.updateLuma();
    }

    auto clip = layerPainter.clipBoundingRect();

    // if the layer has only one renderer then use it as the clip rect
    // when blending 2 buffer and copy back to final buffer to avoid
    // unnecessary pixel processing.
    if (layer->renderList().size() == 1)
    {
        clip = layer->renderList()[0]->rle().boundingRect();
    }

    // 2.3 draw src buffer as mask
    layerPainter.drawBitmap(clip, srcBitmap, clip);
    layerPainter.end();
    // 3. draw the result buffer into painter
    painter->drawBitmap(clip, layerBitmap, clip);

    cache.release_surface(srcBitmap);
    cache.release_surface(layerBitmap);
}